

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void kratos::stmt_set_right(AssignStmt *stmt,Var *target,Var *new_var)

{
  InternalException *this;
  Var **var;
  undefined1 local_48 [40];
  
  var = &stmt->right_;
  switch(stmt->right_->type_) {
  case Base:
  case ConstValue:
  case PortIO:
    if (stmt->right_ != target) {
      this = (InternalException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_48,"Target not found",(allocator<char> *)(local_48 + 0x27));
      InternalException::InternalException(this,(string *)local_48);
      __cxa_throw(this,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
              ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)local_48,
               (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
               &new_var->super_enable_shared_from_this<kratos::Var>);
    *var = (Var *)local_48._0_8_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
    (*((*var)->super_IRNode)._vptr_IRNode[0x14])(*var,new_var);
    break;
  case Expression:
    Var::as<kratos::Expr>((Var *)local_48);
    change_var_expr((shared_ptr<kratos::Expr> *)local_48,target,new_var,true);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
    break;
  case Slice:
    set_slice_var_parent(var,target,new_var,true);
    return;
  default:
    change_var_parent(var,target,new_var);
    return;
  }
  return;
}

Assistant:

void stmt_set_right(AssignStmt *stmt, Var *target, Var *new_var) {
    auto &right = stmt->right();
    if (right->type() == VarType::Base || right->type() == VarType::PortIO ||
        right->type() == VarType::ConstValue) {
        if (right == target) {
            stmt->set_right(new_var->shared_from_this());
            right->move_linked_to(new_var);
        } else {
            throw InternalException("Target not found");
        }
    } else if (right->type() == VarType::Slice) {
        set_slice_var_parent(right, target, new_var, true);
    } else if (right->type() == VarType::Expression) {
        change_var_expr(stmt->right()->as<Expr>(), target, new_var);
    } else {
        change_var_parent(right, target, new_var);
    }
}